

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.cpp
# Opt level: O1

size_t opencollada::String::Replace(string *str,char a,char b)

{
  long lVar1;
  undefined7 in_register_00000031;
  size_t sVar2;
  
  sVar2 = 0;
  lVar1 = ::std::__cxx11::string::find((char)str,CONCAT71(in_register_00000031,a));
  if (lVar1 != -1) {
    sVar2 = 0;
    do {
      (str->_M_dataplus)._M_p[lVar1] = b;
      sVar2 = sVar2 + 1;
      lVar1 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)a);
    } while (lVar1 != -1);
  }
  return sVar2;
}

Assistant:

size_t String::Replace(string & str, char a, char b)
	{
		size_t count = 0;
		for (auto pos = str.find(a); pos != string::npos; pos = str.find(a, pos + 1))
		{
			str[pos] = b;
			++count;
		}
		return count;
	}